

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHelper.hh
# Opt level: O0

void __thiscall QPDFObjectHelper::QPDFObjectHelper(QPDFObjectHelper *this,QPDFObjectHelper *param_1)

{
  QPDFObjectHelper *param_1_local;
  QPDFObjectHelper *this_local;
  
  ::qpdf::BaseHandle::BaseHandle(&this->super_BaseHandle,&param_1->super_BaseHandle);
  this->_vptr_QPDFObjectHelper = (_func_int **)&PTR__QPDFObjectHelper_006f4620;
  QPDFObjectHandle::QPDFObjectHandle(&this->oh_,&param_1->oh_);
  return;
}

Assistant:

class QPDF_DLL_CLASS QPDFObjectHelper: public qpdf::BaseHandle
{
  public:
    QPDFObjectHelper(QPDFObjectHandle oh) :
        qpdf::BaseHandle(oh.getObj())
    {
    }
    QPDF_DLL
    virtual ~QPDFObjectHelper();
    QPDFObjectHandle
    getObjectHandle()
    {
        return {obj};
    }
    QPDFObjectHandle const
    getObjectHandle() const
    {
        return {obj};
    }

  protected:
    QPDF_DLL_PRIVATE
    QPDFObjectHandle
    oh()
    {
        return {obj};
    }